

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

void __thiscall rengine::Signal<>::emit(Signal<> *this,SignalEmitter *emitter)

{
  pointer ppSVar1;
  Bucket *pBVar2;
  pointer ppSVar3;
  
  pBVar2 = findBucket(this,emitter);
  if (pBVar2 != (Bucket *)0x0) {
    ppSVar1 = (pBVar2->handlers).
              super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar3 = (pBVar2->handlers).
                   super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1;
        ppSVar3 = ppSVar3 + 1) {
      (*(*ppSVar3)->_vptr_SignalHandler[2])();
    }
  }
  return;
}

Assistant:

void emit(SignalEmitter *emitter, Arguments ... args)
    {
        if (Bucket *bucket = findBucket(emitter)) {
            for (auto handler : bucket->handlers)
                handler->onSignal(args...);
        }
    }